

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockNodeRemoveWindow
               (ImGuiDockNode *node,ImGuiWindow_conflict *window,ImGuiID save_dock_id)

{
  ImVector<ImGuiWindow_*> *this;
  ImGuiWindow_conflict *pIVar1;
  ImGuiWindow_conflict *pIVar2;
  ImGuiViewportP_conflict1 *pIVar3;
  ImGuiContext_conflict1 *ctx;
  uint flags;
  ImGuiWindow_conflict **ppIVar4;
  int n;
  int iVar5;
  long lVar6;
  ImGuiWindow_conflict *window_local;
  
  ctx = GImGui;
  window_local = window;
  if (window->DockNode != node) {
    __assert_fail("window->DockNode == node",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x3506,
                  "void ImGui::DockNodeRemoveWindow(ImGuiDockNode *, ImGuiWindow *, ImGuiID)");
  }
  if ((save_dock_id != 0) && (node->ID != save_dock_id)) {
    __assert_fail("save_dock_id == 0 || save_dock_id == node->ID",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x3509,
                  "void ImGui::DockNodeRemoveWindow(ImGuiDockNode *, ImGuiWindow *, ImGuiID)");
  }
  window->DockNode = (ImGuiDockNode *)0x0;
  window->field_0x3e1 = window->field_0x3e1 & 0xf6;
  window->DockId = save_dock_id;
  flags = window->Flags & 0xfeffffff;
  window->Flags = flags;
  if (window->ParentWindow != (ImGuiWindow_conflict *)0x0) {
    ImVector<ImGuiWindow_*>::find_erase
              ((ImVector<ImGuiWindow_*> *)&(window->ParentWindow->DC).ChildWindows,&window_local);
    flags = window_local->Flags;
  }
  lVar6 = 0;
  UpdateWindowParentAndRootLinks(window_local,flags,(ImGuiWindow_conflict *)0x0);
  this = &node->Windows;
  iVar5 = 0;
  while( true ) {
    if (this->Size <= iVar5) {
      __assert_fail("erased",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x351e,
                    "void ImGui::DockNodeRemoveWindow(ImGuiDockNode *, ImGuiWindow *, ImGuiID)");
    }
    ppIVar4 = ImVector<ImGuiWindow_*>::operator[](this,iVar5);
    if (*ppIVar4 == window_local) break;
    iVar5 = iVar5 + 1;
    lVar6 = lVar6 + 8;
  }
  ImVector<ImGuiWindow_*>::erase(this,(ImGuiWindow_conflict **)(lVar6 + (long)(node->Windows).Data))
  ;
  if (node->VisibleWindow == window_local) {
    node->VisibleWindow = (ImGuiWindow_conflict *)0x0;
  }
  node->field_0xbe = node->field_0xbe | 2;
  if (node->TabBar == (ImGuiTabBar *)0x0) {
LAB_001c7571:
    iVar5 = this->Size;
    if (iVar5 == 0) {
      if (((node->MergedFlags & 0xc00) == 0) && (window_local->DockId != node->ID)) {
        DockContextRemoveNode(ctx,node,true);
        return;
      }
      goto LAB_001c75f1;
    }
  }
  else {
    TabBarRemoveTab(node->TabBar,window_local->ID);
    iVar5 = (node->Windows).Size;
    if (iVar5 < (int)(((node->MergedFlags & 0x800) == 0) + 1)) {
      DockNodeRemoveTabBar(node);
      goto LAB_001c7571;
    }
  }
  if (((iVar5 == 1) && ((node->MergedFlags & 0x800) == 0)) &&
     (node->HostWindow != (ImGuiWindow_conflict *)0x0)) {
    ppIVar4 = ImVector<ImGuiWindow_*>::operator[](this,0);
    pIVar1 = *ppIVar4;
    pIVar2 = node->HostWindow;
    if ((pIVar2->ViewportOwned == true) && (node->ParentNode == (ImGuiDockNode *)0x0)) {
      pIVar3 = pIVar2->Viewport;
      if (pIVar3->Window != pIVar2) {
        __assert_fail("node->HostWindow->Viewport->Window == node->HostWindow",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                      ,0x353a,
                      "void ImGui::DockNodeRemoveWindow(ImGuiDockNode *, ImGuiWindow *, ImGuiID)");
      }
      pIVar3->Window = pIVar1;
      (pIVar3->super_ImGuiViewport).ID = pIVar1->ID;
    }
    pIVar1->Collapsed = pIVar2->Collapsed;
  }
LAB_001c75f1:
  DockNodeUpdateVisibleFlag(node);
  return;
}

Assistant:

static void ImGui::DockNodeRemoveWindow(ImGuiDockNode* node, ImGuiWindow* window, ImGuiID save_dock_id)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(window->DockNode == node);
    //IM_ASSERT(window->RootWindowDockTree == node->HostWindow);
    //IM_ASSERT(window->LastFrameActive < g.FrameCount);    // We may call this from Begin()
    IM_ASSERT(save_dock_id == 0 || save_dock_id == node->ID);
    IMGUI_DEBUG_LOG_DOCKING("DockNodeRemoveWindow node 0x%08X window '%s'\n", node->ID, window->Name);

    window->DockNode = NULL;
    window->DockIsActive = window->DockTabWantClose = false;
    window->DockId = save_dock_id;
    window->Flags &= ~ImGuiWindowFlags_ChildWindow;
    if (window->ParentWindow)
        window->ParentWindow->DC.ChildWindows.find_erase(window);
    UpdateWindowParentAndRootLinks(window, window->Flags, NULL); // Update immediately

    // Remove window
    bool erased = false;
    for (int n = 0; n < node->Windows.Size; n++)
        if (node->Windows[n] == window)
        {
            node->Windows.erase(node->Windows.Data + n);
            erased = true;
            break;
        }
    if (!erased)
        IM_ASSERT(erased);
    if (node->VisibleWindow == window)
        node->VisibleWindow = NULL;

    // Remove tab and possibly tab bar
    node->WantHiddenTabBarUpdate = true;
    if (node->TabBar)
    {
        TabBarRemoveTab(node->TabBar, window->ID);
        const int tab_count_threshold_for_tab_bar = node->IsCentralNode() ? 1 : 2;
        if (node->Windows.Size < tab_count_threshold_for_tab_bar)
            DockNodeRemoveTabBar(node);
    }

    if (node->Windows.Size == 0 && !node->IsCentralNode() && !node->IsDockSpace() && window->DockId != node->ID)
    {
        // Automatic dock node delete themselves if they are not holding at least one tab
        DockContextRemoveNode(&g, node, true);
        return;
    }

    if (node->Windows.Size == 1 && !node->IsCentralNode() && node->HostWindow)
    {
        ImGuiWindow* remaining_window = node->Windows[0];
        if (node->HostWindow->ViewportOwned && node->IsRootNode())
        {
            // Transfer viewport back to the remaining loose window
            IMGUI_DEBUG_LOG_VIEWPORT("Node %08X transfer Viewport %08X=>%08X for Window '%s'\n", node->ID, node->HostWindow->Viewport->ID, remaining_window->ID, remaining_window->Name);
            IM_ASSERT(node->HostWindow->Viewport->Window == node->HostWindow);
            node->HostWindow->Viewport->Window = remaining_window;
            node->HostWindow->Viewport->ID = remaining_window->ID;
        }
        remaining_window->Collapsed = node->HostWindow->Collapsed;
    }

    // Update visibility immediately is required so the DockNodeUpdateRemoveInactiveChilds() processing can reflect changes up the tree
    DockNodeUpdateVisibleFlag(node);
}